

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O2

void __thiscall
ExprWriterTest_ExponentiationExprPrecedence_Test::ExprWriterTest_ExponentiationExprPrecedence_Test
          (ExprWriterTest_ExponentiationExprPrecedence_Test *this)

{
  ExprWriterTest::ExprWriterTest(&this->super_ExprWriterTest);
  (this->super_ExprWriterTest).super_Test._vptr_Test = (_func_int **)&PTR__ExprWriterTest_0016c570;
  (this->super_ExprWriterTest).super_ExprFactory._vptr_BasicExprFactory =
       (_func_int **)&PTR__ExprWriterTest_ExponentiationExprPrecedence_Test_0016c5b0;
  return;
}

Assistant:

TEST_F(ExprWriterTest, ExponentiationExprPrecedence) {
  auto x1 = MakeVariable(0), x2 = MakeVariable(1), x3 = MakeVariable(2);
  CHECK_WRITE("x1 ^ x2 ^ x3",
      MakeBinary(ex::POW, x1, MakeBinary(ex::POW, x2, x3)));
  CHECK_WRITE("x1 ^ x2 ^ 3",
      MakeBinary(ex::POW, x1, MakeBinary(ex::POW_CONST_BASE, x2,
                                         MakeConst(3))));
  CHECK_WRITE("x1 ^ 3 ^ x2",
      MakeBinary(ex::POW, x1, MakeBinary(ex::POW_CONST_EXP, MakeConst(3), x2)));
  CHECK_WRITE("(x1 ^ 2) ^ 3",
      MakeBinary(ex::POW_CONST_BASE, MakeBinary(ex::POW_CONST_BASE, x1,
                                                MakeConst(2)), MakeConst(3)));
  CHECK_WRITE("-x1 ^ -x2",
      MakeBinary(ex::POW, MakeUnary(ex::MINUS, x1), MakeUnary(ex::MINUS, x2)));
  CHECK_WRITE("x1 ^ (x2 * x3)",
      MakeBinary(ex::POW, x1, MakeBinary(ex::MUL, x2, x3)));
}